

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionHistory.h
# Opt level: O2

void __thiscall ActionHistory::Print(ActionHistory *this)

{
  string asStack_28 [32];
  
  ActionHistory::SoftPrint_abi_cxx11_();
  std::operator<<((ostream *)&std::cout,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}